

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[22],unsigned_long,char[36],unsigned_long,char[3]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [22],unsigned_long *RestArgs,char (*RestArgs_1) [36],
               unsigned_long *RestArgs_2,char (*RestArgs_3) [3])

{
  char (*RestArgs_local_3) [3];
  unsigned_long *RestArgs_local_2;
  char (*RestArgs_local_1) [36];
  unsigned_long *RestArgs_local;
  char (*FirstArg_local) [22];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[22]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_long,char[36],unsigned_long,char[3]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}